

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_DCT.cc
# Opt level: O2

void __thiscall Pl_DCT::Members::Members(Members *this)

{
  this->action = a_decompress;
  Pl_Buffer::Pl_Buffer(&this->buf,"DCT compressed image",(Pipeline *)0x0);
  this->image_width = 0;
  this->image_height = 0;
  this->components = 1;
  this->color_space = JCS_GRAYSCALE;
  this->config_callback = (CompressConfig *)0x0;
  return;
}

Assistant:

Members() :
        action(a_decompress),
        buf("DCT compressed image")
    {
    }